

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  byte bVar1;
  uintptr_t uVar2;
  Id IVar3;
  const_iterator cVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  ulong uVar11;
  bool bVar12;
  
  IVar3 = curr->_id;
  if (IVar3 < LoopId) {
    if (IVar3 == BlockId) goto LAB_00146f53;
    if (IVar3 == InvalidId) goto LAB_001473af;
  }
  else if ((IVar3 == LoopId) || (IVar3 == TryId)) {
LAB_00146f53:
    if (curr[1].type.id != 0) {
      cVar4 = std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)((long)this + 0x158),(key_type *)(curr + 1));
      if (cVar4._M_node == (_Base_ptr)((long)this + 0x160)) {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)((long)this + 0x158),(Name *)(curr + 1));
      }
      else {
        fixAfterChanges::Fixer::replace((Fixer *)this);
      }
    }
    IVar3 = curr->_id;
  }
  else if (IVar3 == NumExpressionIds) goto LAB_001473af;
  lVar5 = 0x18;
  if (IVar3 < RethrowId) {
    if (IVar3 < TryId) {
      if (IVar3 != BreakId) {
        if (IVar3 != SwitchId) {
          if (IVar3 != InvalidId) {
            return;
          }
          goto LAB_001473af;
        }
        uVar2 = curr[3].type.id;
        if (uVar2 == 0) {
LAB_00146ffd:
          uVar6 = curr[1].type.id;
          if (uVar6 == 0) {
            return;
          }
          uVar11 = 0;
          do {
            lVar5 = *(long *)(*(long *)(curr + 1) + 8 + uVar11 * 0x10);
            if (lVar5 != 0) {
              uVar7 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                      *(long *)((long)this + 0xd8);
              if (uVar7 == 0) goto LAB_00147521;
              if (1 < uVar7) {
                uVar7 = (ulong)((int)uVar7 - 2);
                puVar9 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar7 * 8 + -0x50);
                puVar8 = (undefined8 *)((long)this + uVar7 * 8 + 0xe0);
                do {
                  puVar10 = puVar9;
                  if (uVar7 < 10) {
                    puVar10 = puVar8;
                  }
                  bVar1 = *(byte *)*puVar10;
                  if (bVar1 < 3) {
                    if (bVar1 == 1) goto LAB_001470b6;
                    if (bVar1 == 0) goto LAB_001473af;
                  }
                  else if ((bVar1 == 3) || (bVar1 == 0x34)) {
LAB_001470b6:
                    if (*(long *)((byte *)*puVar10 + 0x18) == lVar5) goto LAB_00147062;
                  }
                  else if (bVar1 == 0x60) goto LAB_001473af;
                  puVar9 = puVar9 + -1;
                  puVar8 = puVar8 + -1;
                  bVar12 = uVar7 != 0;
                  uVar7 = uVar7 - 1;
                } while (bVar12);
              }
              fixAfterChanges::Fixer::replace((Fixer *)this);
              uVar6 = curr[1].type.id;
            }
LAB_00147062:
            uVar11 = (ulong)((int)uVar11 + 1);
            if (uVar6 <= uVar11) {
              return;
            }
          } while( true );
        }
        uVar6 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                *(long *)((long)this + 0xd8);
        if (uVar6 != 0) {
          if (1 < uVar6) {
            uVar6 = (ulong)((int)uVar6 - 2);
            puVar8 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar6 * 8 + -0x50);
            puVar9 = (undefined8 *)((long)this + uVar6 * 8 + 0xe0);
            do {
              puVar10 = puVar8;
              if (uVar6 < 10) {
                puVar10 = puVar9;
              }
              bVar1 = *(byte *)*puVar10;
              if (bVar1 < 3) {
                if (bVar1 == 1) goto LAB_001474d9;
                if (bVar1 == 0) goto LAB_001473af;
              }
              else if ((bVar1 == 3) || (bVar1 == 0x34)) {
LAB_001474d9:
                if (*(uintptr_t *)((byte *)*puVar10 + 0x18) == uVar2) goto LAB_00146ffd;
              }
              else if (bVar1 == 0x60) goto LAB_001473af;
              puVar8 = puVar8 + -1;
              puVar9 = puVar9 + -1;
              bVar12 = uVar6 != 0;
              uVar6 = uVar6 - 1;
            } while (bVar12);
          }
          fixAfterChanges::Fixer::replace((Fixer *)this);
          goto LAB_00146ffd;
        }
        goto LAB_00147521;
      }
    }
    else {
      if (IVar3 != TryId) {
        if (IVar3 != TryTableId) {
          return;
        }
        uVar6 = *(ulong *)(curr + 4);
        if (uVar6 == 0) {
          return;
        }
        uVar11 = 0;
        do {
          lVar5 = *(long *)(curr[3].type.id + 8 + uVar11 * 0x10);
          if (lVar5 != 0) {
            uVar7 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                    *(long *)((long)this + 0xd8);
            if (uVar7 == 0) goto LAB_00147521;
            if (1 < uVar7) {
              uVar7 = (ulong)((int)uVar7 - 2);
              puVar9 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar7 * 8 + -0x50);
              puVar8 = (undefined8 *)((long)this + uVar7 * 8 + 0xe0);
              do {
                puVar10 = puVar9;
                if (uVar7 < 10) {
                  puVar10 = puVar8;
                }
                bVar1 = *(byte *)*puVar10;
                if (bVar1 < 3) {
                  if (bVar1 == 1) goto LAB_00147295;
                  if (bVar1 == 0) goto LAB_001473af;
                }
                else if ((bVar1 == 3) || (bVar1 == 0x34)) {
LAB_00147295:
                  if (*(long *)((byte *)*puVar10 + 0x18) == lVar5) goto LAB_00147241;
                }
                else if (bVar1 == 0x60) goto LAB_001473af;
                puVar9 = puVar9 + -1;
                puVar8 = puVar8 + -1;
                bVar12 = uVar7 != 0;
                uVar7 = uVar7 - 1;
              } while (bVar12);
            }
            fixAfterChanges::Fixer::replace((Fixer *)this);
            uVar6 = *(ulong *)(curr + 4);
          }
LAB_00147241:
          uVar11 = (ulong)((int)uVar11 + 1);
          if (uVar6 <= uVar11) {
            return;
          }
        } while( true );
      }
      lVar5 = 0x70;
    }
  }
  else {
    if (SuspendId < IVar3) {
      if (IVar3 == ResumeId) {
        uVar6 = curr[3].type.id;
        if (uVar6 == 0) {
          return;
        }
        uVar11 = 0;
        do {
          lVar5 = *(long *)(*(long *)(curr + 3) + 8 + uVar11 * 0x10);
          if (lVar5 != 0) {
            uVar7 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                    *(long *)((long)this + 0xd8);
            if (uVar7 == 0) goto LAB_00147521;
            if (1 < uVar7) {
              uVar7 = (ulong)((int)uVar7 - 2);
              puVar9 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar7 * 8 + -0x50);
              puVar8 = (undefined8 *)((long)this + uVar7 * 8 + 0xe0);
              do {
                puVar10 = puVar9;
                if (uVar7 < 10) {
                  puVar10 = puVar8;
                }
                bVar1 = *(byte *)*puVar10;
                if (bVar1 < 3) {
                  if (bVar1 == 1) goto LAB_00147394;
                  if (bVar1 == 0) goto LAB_001473af;
                }
                else if ((bVar1 == 3) || (bVar1 == 0x34)) {
LAB_00147394:
                  if (*(long *)((byte *)*puVar10 + 0x18) == lVar5) goto LAB_00147343;
                }
                else if (bVar1 == 0x60) goto LAB_001473af;
                puVar9 = puVar9 + -1;
                puVar8 = puVar8 + -1;
                bVar12 = uVar7 != 0;
                uVar7 = uVar7 - 1;
              } while (bVar12);
            }
            fixAfterChanges::Fixer::replace((Fixer *)this);
            uVar6 = curr[3].type.id;
          }
LAB_00147343:
          uVar11 = (ulong)((int)uVar11 + 1);
          if (uVar6 <= uVar11) {
            return;
          }
        } while( true );
      }
      if (IVar3 == ResumeThrowId) {
        uVar6 = curr[4].type.id;
        if (uVar6 == 0) {
          return;
        }
        uVar11 = 0;
        do {
          lVar5 = *(long *)(*(long *)(curr + 4) + 8 + uVar11 * 0x10);
          if (lVar5 != 0) {
            uVar7 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                    *(long *)((long)this + 0xd8);
            if (uVar7 == 0) goto LAB_00147521;
            if (1 < uVar7) {
              uVar7 = (ulong)((int)uVar7 - 2);
              puVar9 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar7 * 8 + -0x50);
              puVar8 = (undefined8 *)((long)this + uVar7 * 8 + 0xe0);
              do {
                puVar10 = puVar9;
                if (uVar7 < 10) {
                  puVar10 = puVar8;
                }
                bVar1 = *(byte *)*puVar10;
                if (bVar1 < 3) {
                  if (bVar1 == 1) goto LAB_001471aa;
                  if (bVar1 == 0) goto LAB_001473af;
                }
                else if ((bVar1 == 3) || (bVar1 == 0x34)) {
LAB_001471aa:
                  if (*(long *)((byte *)*puVar10 + 0x18) == lVar5) goto LAB_00147156;
                }
                else if (bVar1 == 0x60) goto LAB_001473af;
                puVar9 = puVar9 + -1;
                puVar8 = puVar8 + -1;
                bVar12 = uVar7 != 0;
                uVar7 = uVar7 - 1;
              } while (bVar12);
            }
            fixAfterChanges::Fixer::replace((Fixer *)this);
            uVar6 = curr[4].type.id;
          }
LAB_00147156:
          uVar11 = (ulong)((int)uVar11 + 1);
          if (uVar6 <= uVar11) {
            return;
          }
        } while( true );
      }
      if (IVar3 != NumExpressionIds) {
        return;
      }
LAB_001473af:
      wasm::handle_unreachable
                ("unexpected expression type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                 ,0x103);
    }
    if (IVar3 != RethrowId) {
      if (IVar3 != BrOnId) {
        return;
      }
      lVar5 = 0x20;
    }
  }
  if (*(long *)(&curr->_id + lVar5) == 0) {
    return;
  }
  uVar6 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
          *(long *)((long)this + 0xd8);
  if (uVar6 != 0) {
    if (1 < uVar6) {
      uVar6 = (ulong)((int)uVar6 - 2);
      puVar8 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar6 * 8 + -0x50);
      puVar9 = (undefined8 *)((long)this + uVar6 * 8 + 0xe0);
      do {
        puVar10 = puVar8;
        if (uVar6 < 10) {
          puVar10 = puVar9;
        }
        bVar1 = *(byte *)*puVar10;
        if (bVar1 < 3) {
          if (bVar1 == 1) goto LAB_00147466;
          if (bVar1 == 0) goto LAB_001473af;
        }
        else if ((bVar1 == 3) || (bVar1 == 0x34)) {
LAB_00147466:
          if (*(long *)((byte *)*puVar10 + 0x18) == *(long *)(&curr->_id + lVar5)) {
            return;
          }
        }
        else if (bVar1 == 0x60) goto LAB_001473af;
        puVar8 = puVar8 + -1;
        puVar9 = puVar9 + -1;
        bVar12 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while (bVar12);
    }
    fixAfterChanges::Fixer::replace((Fixer *)this);
    return;
  }
LAB_00147521:
  __assert_fail("!expressionStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x766,
                "bool wasm::TranslateToFuzzReader::fixAfterChanges(Function *)::Fixer::hasBreakTarget(Name)"
               );
}

Assistant:

void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (seen.count(name)) {
            replace();
          } else {
            seen.insert(name);
          }
        }
      });
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          replaceIfInvalid(name);
        }
      });
    }